

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O3

void __thiscall CEditorImage::LoadAutoMapper(CEditorImage *this)

{
  IStorage *pIVar1;
  json_object_entry *pjVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  char *pcVar5;
  json_value *value;
  ulong uVar6;
  CDoodadsMapper *this_00;
  _func_int **pp_Var7;
  char *pcVar8;
  undefined8 uVar9;
  IConsole *pIVar10;
  uint size;
  _json_value *p_Var11;
  long in_FS_OFFSET;
  json_settings JsonSettings;
  char aError [256];
  char aBuf [512];
  json_settings local_368;
  char local_338 [256];
  char local_238 [512];
  long local_38;
  IOHANDLE io;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_pAutoMapper != (IAutoMapper *)0x0) goto LAB_00192ada;
  str_format(local_238,0x200,"editor/automap/%s.json",this->m_aName);
  pIVar1 = this->m_pEditor->m_pStorage;
  iVar3 = (*(pIVar1->super_IInterface)._vptr_IInterface[4])(pIVar1,local_238,1,0xffffffff,0,0,0,0);
  io = (IOHANDLE)CONCAT44(extraout_var,iVar3);
  if (io == (IOHANDLE)0x0) goto LAB_00192ada;
  lVar4 = io_length(io);
  size = (uint)lVar4;
  pcVar5 = (char *)mem_alloc(size);
  io_read(io,pcVar5,size);
  io_close(io);
  mem_zero(&local_368,0x30);
  value = json_parse_ex(&local_368,pcVar5,(long)(int)size,local_338);
  mem_free(pcVar5);
  if (value == (json_value *)0x0) {
    pIVar10 = this->m_pEditor->m_pConsole;
    pp_Var7 = (pIVar10->super_IInterface)._vptr_IInterface;
    pcVar8 = local_238;
    pcVar5 = local_338;
    uVar9 = 1;
  }
  else {
    if ((value->type == json_object) && (uVar6 = (ulong)(value->u).string.length, uVar6 != 0)) {
      pjVar2 = (value->u).object.values;
      lVar4 = 0;
      do {
        iVar3 = strcmp(*(char **)((long)&pjVar2->name + lVar4),"tileset");
        if (iVar3 == 0) {
          p_Var11 = *(_json_value **)((long)&pjVar2->value + lVar4);
          goto LAB_00192c73;
        }
        lVar4 = lVar4 + 0x18;
      } while (uVar6 * 0x18 != lVar4);
      p_Var11 = &json_value_none;
LAB_00192c73:
      if (p_Var11->type != json_array) {
        p_Var11 = &json_value_none;
        if (uVar6 != 0) {
          pjVar2 = (value->u).object.values;
          lVar4 = 0;
          do {
            iVar3 = strcmp(*(char **)((long)&pjVar2->name + lVar4),"doodads");
            if (iVar3 == 0) {
              p_Var11 = *(_json_value **)((long)&pjVar2->value + lVar4);
              goto LAB_00192c25;
            }
            lVar4 = lVar4 + 0x18;
          } while (uVar6 * 0x18 != lVar4);
          p_Var11 = &json_value_none;
        }
        goto LAB_00192c25;
      }
      this_00 = (CDoodadsMapper *)operator_new(0x28);
      CTilesetMapper::CTilesetMapper((CTilesetMapper *)this_00,this->m_pEditor);
LAB_00192c9d:
      this->m_pAutoMapper = &this_00->super_IAutoMapper;
      (*(this_00->super_IAutoMapper)._vptr_IAutoMapper[2])(this_00,p_Var11);
    }
    else {
      p_Var11 = &json_value_none;
LAB_00192c25:
      if (p_Var11->type == json_array) {
        this_00 = (CDoodadsMapper *)operator_new(0x68);
        CDoodadsMapper::CDoodadsMapper(this_00,this->m_pEditor);
        goto LAB_00192c9d;
      }
    }
    json_value_free(value);
    if ((this->m_pAutoMapper == (IAutoMapper *)0x0) || (this->m_pEditor->m_pConfig->m_Debug == 0))
    goto LAB_00192ada;
    iVar3 = this->m_pAutoMapper->m_Type;
    pcVar5 = "";
    if (iVar3 == 1) {
      pcVar5 = "doodads";
    }
    pcVar8 = "tileset";
    if (iVar3 != 0) {
      pcVar8 = pcVar5;
    }
    pcVar5 = local_238;
    str_format(pcVar5,0x200,"loaded %s.json (%s)",this->m_aName,pcVar8);
    pIVar10 = this->m_pEditor->m_pConsole;
    pp_Var7 = (pIVar10->super_IInterface)._vptr_IInterface;
    pcVar8 = "editor";
    uVar9 = 2;
  }
  (*pp_Var7[0x19])(pIVar10,uVar9,pcVar8,pcVar5,0);
LAB_00192ada:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CEditorImage::LoadAutoMapper()
{
	if(m_pAutoMapper)
		return;

	// read file data into buffer
	char aBuf[IO_MAX_PATH_LENGTH];
	str_format(aBuf, sizeof(aBuf), "editor/automap/%s.json", m_aName);
	IOHANDLE File = m_pEditor->Storage()->OpenFile(aBuf, IOFLAG_READ, IStorage::TYPE_ALL);
	if(!File)
		return;
	int FileSize = (int)io_length(File);
	char *pFileData = (char *)mem_alloc(FileSize);
	io_read(File, pFileData, FileSize);
	io_close(File);

	// parse json data
	json_settings JsonSettings;
	mem_zero(&JsonSettings, sizeof(JsonSettings));
	char aError[256];
	json_value *pJsonData = json_parse_ex(&JsonSettings, pFileData, FileSize, aError);
	mem_free(pFileData);

	if(pJsonData == 0)
	{
		m_pEditor->Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, aBuf, aError);
		return;
	}

	// generate configurations
	const json_value &rTileset = (*pJsonData)[(const char *)IAutoMapper::GetTypeName(IAutoMapper::TYPE_TILESET)];
	if(rTileset.type == json_array)
	{
		m_pAutoMapper = new CTilesetMapper(m_pEditor);
		m_pAutoMapper->Load(rTileset);
	}
	else
	{
		const json_value &rDoodads = (*pJsonData)[(const char *)IAutoMapper::GetTypeName(IAutoMapper::TYPE_DOODADS)];
		if(rDoodads.type == json_array)
		{
			m_pAutoMapper = new CDoodadsMapper(m_pEditor);
			m_pAutoMapper->Load(rDoodads);
		}
	}

	// clean up
	json_value_free(pJsonData);
	if(m_pAutoMapper && m_pEditor->Config()->m_Debug)
	{
		str_format(aBuf, sizeof(aBuf),"loaded %s.json (%s)", m_aName, IAutoMapper::GetTypeName(m_pAutoMapper->GetType()));
		m_pEditor->Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "editor", aBuf);
	}
}